

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

int getBestIndex(double *icvals,int N)

{
  double local_30;
  double local_28;
  double best;
  int local_18;
  int i;
  int bind;
  int N_local;
  double *icvals_local;
  
  if ((*icvals != *icvals) || (NAN(*icvals) || NAN(*icvals))) {
    local_30 = 1.79769313486232e+308;
  }
  else {
    local_30 = *icvals;
  }
  local_28 = local_30;
  local_18 = -1;
  if (*icvals == *icvals) {
    local_18 = 0;
  }
  for (best._4_4_ = 1; best._4_4_ < N; best._4_4_ = best._4_4_ + 1) {
    if (((icvals[best._4_4_] < local_28) && (icvals[best._4_4_] == icvals[best._4_4_])) &&
       (!NAN(icvals[best._4_4_]) && !NAN(icvals[best._4_4_]))) {
      local_18 = best._4_4_;
      local_28 = icvals[best._4_4_];
    }
  }
  return local_18;
}

Assistant:

static int getBestIndex(double *icvals,int N) {
    int bind,i;
    double best;

    best = icvals[0] == icvals[0] ? icvals[0] : DBL_MAX;
    bind = icvals[0] == icvals[0] ? 0 : -1;

    for(i = 1; i < N;++i) {
        if (icvals[i] < best && icvals[i] == icvals[i]) {
            bind = i;
            best = icvals[i];
        }
    }

    return bind;
}